

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodetxb.c
# Opt level: O0

int read_golomb(MACROBLOCKD *xd,aom_reader *r)

{
  int iVar1;
  long in_RDI;
  int i;
  int length;
  int x;
  uint in_stack_ffffffffffffffe0;
  int iVar2;
  int local_18;
  int local_14;
  
  local_14 = 1;
  local_18 = 0;
  iVar2 = 0;
  do {
    if (iVar2 != 0) goto LAB_001cb479;
    iVar2 = aom_read_bit_((aom_reader *)(ulong)in_stack_ffffffffffffffe0);
    local_18 = local_18 + 1;
  } while (local_18 < 0x15);
  aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x29f0),AOM_CODEC_CORRUPT_FRAME,
                     "Invalid length in read_golomb");
LAB_001cb479:
  for (iVar2 = 0; iVar2 < local_18 + -1; iVar2 = iVar2 + 1) {
    iVar1 = aom_read_bit_((aom_reader *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
    local_14 = iVar1 + local_14 * 2;
  }
  return local_14 + -1;
}

Assistant:

static int read_golomb(MACROBLOCKD *xd, aom_reader *r) {
  int x = 1;
  int length = 0;
  int i = 0;

  while (!i) {
    i = aom_read_bit(r, ACCT_STR);
    ++length;
    if (length > 20) {
      aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid length in read_golomb");
      break;
    }
  }

  for (i = 0; i < length - 1; ++i) {
    x <<= 1;
    x += aom_read_bit(r, ACCT_STR);
  }

  return x - 1;
}